

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O0

size_t __thiscall dg::DGLLVMPointsToSet::size(DGLLVMPointsToSet *this)

{
  size_t sVar1;
  
  sVar1 = pta::PointerIdPointsToSet::size((PointerIdPointsToSet *)0x1665f2);
  return sVar1;
}

Assistant:

size_t size() const override { return PTSet.size(); }